

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueTest.hpp
# Opt level: O3

void Qentem::Test::TestAddition5(QTest *test)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [8];
  SizeT SVar6;
  uint uVar7;
  char *pcVar8;
  undefined4 uVar9;
  Value<char> *pVVar10;
  SizeT offset;
  long lVar11;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 *paVar12;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 *paVar13;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 *paVar14;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 *paVar15;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 *paVar16;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 *paVar17;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 *paVar18;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 *paVar19;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 *paVar20;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 *paVar21;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 *paVar22;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 *paVar23;
  bool bVar24;
  bool bVar25;
  ValueC value1;
  ValueC value2;
  char *c_str;
  VArray arr_var;
  char *c_str2;
  ValueC *arr_storage;
  VString str;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 local_d8;
  char local_c8;
  undefined1 local_b8 [8];
  undefined8 uStack_b0;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 local_a8;
  char local_98;
  anon_union_16_5_5c8fea6c_for_Value<char>_1 local_88;
  undefined1 local_78;
  Value<char> *local_70;
  Array<Qentem::Value<char>_> local_68;
  Value<char> *local_50;
  Value<char> *local_48;
  StringT local_40;
  
  paVar19 = &local_d8;
  paVar12 = &local_d8;
  paVar15 = &local_d8;
  paVar16 = &local_d8;
  paVar17 = &local_d8;
  paVar18 = &local_d8;
  paVar20 = &local_d8;
  paVar13 = &local_d8;
  paVar21 = &local_d8;
  paVar22 = &local_d8;
  paVar23 = &local_d8;
  paVar14 = &local_d8;
  local_40.storage_ = (char *)0x0;
  local_c8 = '\0';
  local_40.length_ = 0;
  local_d8.array_.storage_ = (Value<char> *)0x0;
  local_d8._8_8_ = 0;
  local_98 = 0;
  local_a8.array_.storage_ = (Value<char> *)0x0;
  local_a8._8_8_ = 0;
  local_68.storage_ = (Value<char> *)0x0;
  local_68.index_ = 0;
  local_68.capacity_ = 0;
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = '\b';
  QTest::IsTrue(test,true,0xf84);
  if (local_c8 == '\x03') {
LAB_0011b7ef:
    Array<Qentem::Value<char>_>::operator+=(&local_d8.array_,(Value<char> *)&local_a8.array_);
  }
  else {
    if ((local_c8 != '\x02') || (local_98 != '\x02')) {
      Value<char>::reset((Value<char> *)&local_d8.array_);
      local_c8 = '\x03';
      goto LAB_0011b7ef;
    }
    HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator+=
              ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_d8.array_,
               (HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_a8.array_);
    local_98 = '\0';
  }
  if (local_c8 == '\x03') {
    bVar24 = true;
  }
  else if (local_c8 == '\x01') {
    bVar24 = (local_d8.array_.storage_)->type_ == Array;
  }
  else {
    bVar24 = false;
  }
  QTest::IsTrue(test,bVar24,0xf88);
  for (; *(byte *)((long)paVar19 + 0x10) == 1;
      paVar19 = *(anon_union_16_5_5c8fea6c_for_Value<char>_1 **)&paVar19->array_) {
  }
  if (*(byte *)((long)paVar19 + 0x10) - 2 < 2) {
    local_88._0_4_ = *(undefined4 *)((long)&paVar19->array_ + 8);
  }
  else {
    local_88._0_4_ = 0;
  }
  local_b8._0_4_ = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)local_b8,0xf89);
  pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,0);
  if (pVVar10->type_ == True) {
    bVar24 = true;
  }
  else if (pVVar10->type_ == ValuePtr) {
    bVar24 = ((pVVar10->field_0).array_.storage_)->type_ == True;
  }
  else {
    bVar24 = false;
  }
  QTest::IsTrue(test,bVar24,0xf8a);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_78 = 8;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_78 = 9;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_78 = 10;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  String<char>::String((String<char> *)local_b8,"v");
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_88.number_ = (QNumber64)local_b8;
  SVar6 = (SizeT)uStack_b0;
  uStack_b0._0_4_ = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uStack_b0;
  _local_b8 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
               )(auVar1 << 0x40);
  local_88.array_.index_ = SVar6;
  local_78 = 4;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  auVar5 = local_b8;
  if (local_b8 != (undefined1  [8])0x0) {
    MemoryRecord::RemoveAllocation((void *)local_b8);
  }
  operator_delete((void *)auVar5);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  local_88.number_ = (QNumber64)0x4;
  local_78 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  _local_b8 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
               )(ZEXT816(0x100000000) << 0x40);
  Array<Qentem::Value<char>_>::allocate((Array<Qentem::Value<char>_> *)local_b8);
  if (local_98 != '\x03') {
    Value<char>::reset((Value<char> *)&local_a8.array_);
    local_98 = '\x03';
  }
  if ((SizeT)uStack_b0 == 0) {
    local_88.number_ = (QNumber64)local_b8;
    uVar7 = uStack_b0._4_4_;
    _local_b8 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                 )ZEXT816(0);
    local_88._8_8_ = (ulong)uVar7 << 0x20;
    local_78 = 3;
    Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_88.array_);
    Value<char>::~Value((Value<char> *)&local_88.array_);
  }
  else {
    Array<Qentem::Value<char>_>::operator+=
              (&local_a8.array_,(Array<Qentem::Value<char>_> *)local_b8);
  }
  Array<Qentem::Value<char>_>::~Array((Array<Qentem::Value<char>_> *)local_b8);
  _local_b8 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
               )ZEXT816(0);
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  allocate((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
            *)local_b8,1);
  if (local_98 == '\x03') {
LAB_0011bb21:
    local_88.number_ = (QNumber64)local_b8;
    local_88._8_8_ = uStack_b0;
    _local_b8 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
                 )(ZEXT816(0) << 0x20);
    local_78 = 2;
    Array<Qentem::Value<char>_>::operator+=(&local_a8.array_,(Value<char> *)&local_88.array_);
    Value<char>::~Value((Value<char> *)&local_88.array_);
  }
  else {
    if (local_98 != '\x02') {
      Value<char>::reset((Value<char> *)&local_a8.array_);
      local_98 = '\x03';
      goto LAB_0011bb21;
    }
    HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator+=
              ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_a8.array_,
               (HArray<Qentem::String<char>,_Qentem::Value<char>_> *)local_b8);
  }
  HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>::
  ~HashTable((HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
              *)local_b8);
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = 8;
  if (local_c8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_d8.array_);
    local_c8 = '\x03';
  }
  Array<Qentem::Value<char>_>::operator+=(&local_d8.array_,(Value<char> *)&local_a8.array_);
  if (local_c8 == '\x03') {
    bVar24 = true;
  }
  else if (local_c8 == '\x01') {
    bVar24 = (local_d8.array_.storage_)->type_ == Array;
  }
  else {
    bVar24 = false;
  }
  QTest::IsTrue(test,bVar24,0xf96);
  for (; *(byte *)((long)paVar12 + 0x10) == 1;
      paVar12 = *(anon_union_16_5_5c8fea6c_for_Value<char>_1 **)&paVar12->array_) {
  }
  if (*(byte *)((long)paVar12 + 0x10) - 2 < 2) {
    uVar9 = *(undefined4 *)((long)&paVar12->array_ + 8);
  }
  else {
    uVar9 = 0;
  }
  local_88._0_4_ = uVar9;
  local_b8._0_4_ = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)local_b8,0xf97);
  pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,0);
  bVar25 = true;
  bVar24 = true;
  if (pVVar10->type_ != True) {
    if (pVVar10->type_ == ValuePtr) {
      bVar24 = ((pVVar10->field_0).array_.storage_)->type_ == True;
    }
    else {
      bVar24 = false;
    }
  }
  QTest::IsTrue(test,bVar24,0xf98);
  pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,1);
  if (pVVar10->type_ != True) {
    if (pVVar10->type_ == ValuePtr) {
      bVar25 = ((pVVar10->field_0).array_.storage_)->type_ == True;
    }
    else {
      bVar25 = false;
    }
  }
  QTest::IsTrue(test,bVar25,0xf99);
  Value<char>::reset((Value<char> *)&local_d8.array_);
  local_c8 = '\0';
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = 9;
  if (local_c8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_d8.array_);
    local_c8 = '\x03';
  }
  Array<Qentem::Value<char>_>::operator+=(&local_d8.array_,(Value<char> *)&local_a8.array_);
  if (local_c8 == '\x03') {
    bVar24 = true;
  }
  else if (local_c8 == '\x01') {
    bVar24 = (local_d8.array_.storage_)->type_ == Array;
  }
  else {
    bVar24 = false;
  }
  QTest::IsTrue(test,bVar24,0xfa1);
  for (; *(byte *)((long)paVar15 + 0x10) == 1;
      paVar15 = *(anon_union_16_5_5c8fea6c_for_Value<char>_1 **)&paVar15->array_) {
  }
  if (*(byte *)((long)paVar15 + 0x10) - 2 < 2) {
    uVar9 = *(undefined4 *)((long)&paVar15->array_ + 8);
  }
  else {
    uVar9 = 0;
  }
  local_88._0_4_ = uVar9;
  local_b8._0_4_ = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)local_b8,0xfa2);
  pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,0);
  if (pVVar10->type_ == False) {
    bVar24 = true;
  }
  else if (pVVar10->type_ == ValuePtr) {
    bVar24 = ((pVVar10->field_0).array_.storage_)->type_ == False;
  }
  else {
    bVar24 = false;
  }
  QTest::IsTrue(test,bVar24,0xfa3);
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = 9;
  if (local_c8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_d8.array_);
    local_c8 = '\x03';
  }
  Array<Qentem::Value<char>_>::operator+=(&local_d8.array_,(Value<char> *)&local_a8.array_);
  if (local_c8 == '\x03') {
    bVar24 = true;
  }
  else if (local_c8 == '\x01') {
    bVar24 = (local_d8.array_.storage_)->type_ == Array;
  }
  else {
    bVar24 = false;
  }
  QTest::IsTrue(test,bVar24,0xfa7);
  for (; *(byte *)((long)paVar16 + 0x10) == 1;
      paVar16 = *(anon_union_16_5_5c8fea6c_for_Value<char>_1 **)&paVar16->array_) {
  }
  if (*(byte *)((long)paVar16 + 0x10) - 2 < 2) {
    uVar9 = *(undefined4 *)((long)&paVar16->array_ + 8);
  }
  else {
    uVar9 = 0;
  }
  local_88._0_4_ = uVar9;
  local_b8._0_4_ = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)local_b8,0xfa8);
  pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,0);
  bVar25 = true;
  bVar24 = true;
  if (pVVar10->type_ != False) {
    if (pVVar10->type_ == ValuePtr) {
      bVar24 = ((pVVar10->field_0).array_.storage_)->type_ == False;
    }
    else {
      bVar24 = false;
    }
  }
  QTest::IsTrue(test,bVar24,0xfa9);
  pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,1);
  if (pVVar10->type_ != False) {
    if (pVVar10->type_ == ValuePtr) {
      bVar25 = ((pVVar10->field_0).array_.storage_)->type_ == False;
    }
    else {
      bVar25 = false;
    }
  }
  QTest::IsTrue(test,bVar25,0xfaa);
  Value<char>::reset((Value<char> *)&local_d8.array_);
  local_c8 = '\0';
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = 10;
  if (local_c8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_d8.array_);
    local_c8 = '\x03';
  }
  Array<Qentem::Value<char>_>::operator+=(&local_d8.array_,(Value<char> *)&local_a8.array_);
  if (local_c8 == '\x03') {
    bVar24 = true;
  }
  else if (local_c8 == '\x01') {
    bVar24 = (local_d8.array_.storage_)->type_ == Array;
  }
  else {
    bVar24 = false;
  }
  QTest::IsTrue(test,bVar24,0xfb1);
  for (; *(byte *)((long)paVar17 + 0x10) == 1;
      paVar17 = *(anon_union_16_5_5c8fea6c_for_Value<char>_1 **)&paVar17->array_) {
  }
  if (*(byte *)((long)paVar17 + 0x10) - 2 < 2) {
    uVar9 = *(undefined4 *)((long)&paVar17->array_ + 8);
  }
  else {
    uVar9 = 0;
  }
  local_88._0_4_ = uVar9;
  local_b8._0_4_ = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)local_b8,0xfb2);
  pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,0);
  if (pVVar10->type_ == Null) {
    bVar24 = true;
  }
  else if (pVVar10->type_ == ValuePtr) {
    bVar24 = ((pVVar10->field_0).array_.storage_)->type_ == Null;
  }
  else {
    bVar24 = false;
  }
  QTest::IsTrue(test,bVar24,0xfb3);
  Value<char>::reset((Value<char> *)&local_a8.array_);
  local_98 = '\n';
  if (local_c8 != '\x03') {
    Value<char>::reset((Value<char> *)&local_d8.array_);
    local_c8 = '\x03';
  }
  Array<Qentem::Value<char>_>::operator+=(&local_d8.array_,(Value<char> *)&local_a8.array_);
  if (local_c8 == '\x03') {
    bVar24 = true;
  }
  else if (local_c8 == '\x01') {
    bVar24 = (local_d8.array_.storage_)->type_ == Array;
  }
  else {
    bVar24 = false;
  }
  QTest::IsTrue(test,bVar24,0xfb7);
  for (; *(byte *)((long)paVar18 + 0x10) == 1;
      paVar18 = *(anon_union_16_5_5c8fea6c_for_Value<char>_1 **)&paVar18->array_) {
  }
  if (*(byte *)((long)paVar18 + 0x10) - 2 < 2) {
    uVar9 = *(undefined4 *)((long)&paVar18->array_ + 8);
  }
  else {
    uVar9 = 0;
  }
  local_88._0_4_ = uVar9;
  local_b8._0_4_ = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)local_b8,0xfb8);
  pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,0);
  bVar25 = true;
  bVar24 = true;
  if (pVVar10->type_ != Null) {
    if (pVVar10->type_ == ValuePtr) {
      bVar24 = ((pVVar10->field_0).array_.storage_)->type_ == Null;
    }
    else {
      bVar24 = false;
    }
  }
  QTest::IsTrue(test,bVar24,0xfb9);
  pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,1);
  if (pVVar10->type_ != Null) {
    if (pVVar10->type_ == ValuePtr) {
      bVar25 = ((pVVar10->field_0).array_.storage_)->type_ == Null;
    }
    else {
      bVar25 = false;
    }
  }
  QTest::IsTrue(test,bVar25,0xfba);
  Value<char>::reset((Value<char> *)&local_d8.array_);
  local_c8 = '\0';
  String<char>::String((String<char> *)&local_88.array_,"-ABCDEF0123456789ABCDEF0123456789-");
  pcVar8 = local_40.storage_;
  if (local_40.storage_ != (char *)0x0) {
    MemoryRecord::RemoveAllocation(local_40.storage_);
  }
  operator_delete(pcVar8);
  local_40.storage_ = (char *)local_88.array_.storage_;
  local_40.length_ = local_88.array_.index_;
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  operator_delete((void *)0x0);
  local_70 = (Value<char> *)local_40.storage_;
  Value<char>::operator=((Value<char> *)&local_a8.array_,&local_40);
  if (local_c8 == '\x03') {
LAB_0011c16d:
    Array<Qentem::Value<char>_>::operator+=(&local_d8.array_,(Value<char> *)&local_a8.array_);
  }
  else {
    if ((local_c8 != '\x02') || (local_98 != '\x02')) {
      Value<char>::reset((Value<char> *)&local_d8.array_);
      local_c8 = '\x03';
      goto LAB_0011c16d;
    }
    HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator+=
              ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_d8.array_,
               (HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_a8.array_);
    local_98 = '\0';
  }
  if (local_c8 == '\x03') {
    bVar24 = true;
  }
  else if (local_c8 == '\x01') {
    bVar24 = (local_d8.array_.storage_)->type_ == Array;
  }
  else {
    bVar24 = false;
  }
  QTest::IsTrue(test,bVar24,0xfc3);
  for (; *(byte *)((long)paVar20 + 0x10) == 1;
      paVar20 = *(anon_union_16_5_5c8fea6c_for_Value<char>_1 **)&paVar20->array_) {
  }
  if (*(byte *)((long)paVar20 + 0x10) - 2 < 2) {
    uVar9 = *(undefined4 *)((long)&paVar20->array_ + 8);
  }
  else {
    uVar9 = 0;
  }
  local_88._0_4_ = uVar9;
  local_b8._0_4_ = 1;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)local_b8,0xfc4);
  pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,0);
  if (pVVar10->type_ == String) {
    bVar24 = true;
  }
  else if (pVVar10->type_ == ValuePtr) {
    bVar24 = ((pVVar10->field_0).array_.storage_)->type_ == String;
  }
  else {
    bVar24 = false;
  }
  QTest::IsTrue(test,bVar24,0xfc5);
  for (pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,0);
      pVVar10->type_ == ValuePtr; pVVar10 = (pVVar10->field_0).array_.storage_) {
  }
  if (pVVar10->type_ == String) {
    local_88.array_.storage_ = (pVVar10->field_0).array_.storage_;
  }
  else {
    local_88.array_.storage_ = (Value<char> *)0x0;
  }
  QTest::IsEqual<char_const*,char_const*>(test,(char **)&local_88.value_,(char **)&local_70,0xfc6);
  for (pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,0);
      pVVar10->type_ == ValuePtr; pVVar10 = (pVVar10->field_0).array_.storage_) {
  }
  if (pVVar10->type_ == String) {
    pVVar10 = (pVVar10->field_0).array_.storage_;
  }
  else {
    pVVar10 = (Value<char> *)0x0;
  }
  lVar11 = 0;
  do {
    if (*(char *)((long)&pVVar10->field_0 + lVar11) != "-ABCDEF0123456789ABCDEF0123456789-"[lVar11])
    {
      bVar24 = lVar11 == 0x22;
      goto LAB_0011c2a8;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x22);
  bVar24 = true;
LAB_0011c2a8:
  QTest::IsTrue(test,bVar24,0xfc7);
  String<char>::String((String<char> *)&local_88.array_,"#0123456789ABCDEF0123456789ABCDEF#");
  pcVar8 = local_40.storage_;
  if ((Value<char> *)local_40.storage_ != (Value<char> *)0x0) {
    MemoryRecord::RemoveAllocation(local_40.storage_);
  }
  operator_delete(pcVar8);
  local_40.storage_ = (char *)local_88.array_.storage_;
  local_40.length_ = local_88.array_.index_;
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
  operator_delete((void *)0x0);
  local_50 = (Value<char> *)local_40.storage_;
  Value<char>::operator=((Value<char> *)&local_a8.array_,&local_40);
  if (local_c8 != '\x03') {
    if ((local_c8 == '\x02') && (local_98 == '\x02')) {
      HArray<Qentem::String<char>,_Qentem::Value<char>_>::operator+=
                ((HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_d8.array_,
                 (HArray<Qentem::String<char>,_Qentem::Value<char>_> *)&local_a8.array_);
      local_98 = '\0';
      goto LAB_0011c37d;
    }
    Value<char>::reset((Value<char> *)&local_d8.array_);
    local_c8 = '\x03';
  }
  Array<Qentem::Value<char>_>::operator+=(&local_d8.array_,(Value<char> *)&local_a8.array_);
LAB_0011c37d:
  if (local_c8 == '\x03') {
    bVar24 = true;
  }
  else if (local_c8 == '\x01') {
    bVar24 = (local_d8.array_.storage_)->type_ == Array;
  }
  else {
    bVar24 = false;
  }
  QTest::IsTrue(test,bVar24,0xfce);
  for (; *(byte *)((long)paVar13 + 0x10) == 1;
      paVar13 = *(anon_union_16_5_5c8fea6c_for_Value<char>_1 **)&paVar13->array_) {
  }
  if (*(byte *)((long)paVar13 + 0x10) - 2 < 2) {
    uVar9 = *(undefined4 *)((long)&paVar13->array_ + 8);
  }
  else {
    uVar9 = 0;
  }
  local_88._0_4_ = uVar9;
  local_b8._0_4_ = 2;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)local_b8,0xfcf);
  pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,0);
  bVar25 = true;
  bVar24 = true;
  if (pVVar10->type_ != String) {
    if (pVVar10->type_ == ValuePtr) {
      bVar24 = ((pVVar10->field_0).array_.storage_)->type_ == String;
    }
    else {
      bVar24 = false;
    }
  }
  QTest::IsTrue(test,bVar24,0xfd0);
  pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,1);
  if (pVVar10->type_ != String) {
    if (pVVar10->type_ == ValuePtr) {
      bVar25 = ((pVVar10->field_0).array_.storage_)->type_ == String;
    }
    else {
      bVar25 = false;
    }
  }
  QTest::IsTrue(test,bVar25,0xfd1);
  for (pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,0);
      pVVar10->type_ == ValuePtr; pVVar10 = (pVVar10->field_0).array_.storage_) {
  }
  if (pVVar10->type_ == String) {
    local_88.array_.storage_ = (pVVar10->field_0).array_.storage_;
  }
  else {
    local_88.array_.storage_ = (Value<char> *)0x0;
  }
  QTest::IsEqual<char_const*,char_const*>(test,(char **)&local_88.value_,(char **)&local_70,0xfd2);
  for (pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,1);
      pVVar10->type_ == ValuePtr; pVVar10 = (pVVar10->field_0).array_.storage_) {
  }
  if (pVVar10->type_ == String) {
    local_88.array_.storage_ = (pVVar10->field_0).array_.storage_;
  }
  else {
    local_88.array_.storage_ = (Value<char> *)0x0;
  }
  QTest::IsEqual<char_const*,char_const*>(test,(char **)&local_88.value_,(char **)&local_50,0xfd3);
  for (pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,0);
      pVVar10->type_ == ValuePtr; pVVar10 = (pVVar10->field_0).array_.storage_) {
  }
  if (pVVar10->type_ == String) {
    pVVar10 = (pVVar10->field_0).array_.storage_;
  }
  else {
    pVVar10 = (Value<char> *)0x0;
  }
  lVar11 = 0;
  do {
    if (*(char *)((long)&pVVar10->field_0 + lVar11) != "-ABCDEF0123456789ABCDEF0123456789-"[lVar11])
    {
      bVar24 = lVar11 == 0x22;
      goto LAB_0011c52c;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x22);
  bVar24 = true;
LAB_0011c52c:
  QTest::IsTrue(test,bVar24,0xfd4);
  for (pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,1);
      pVVar10->type_ == ValuePtr; pVVar10 = (pVVar10->field_0).array_.storage_) {
  }
  if (pVVar10->type_ == String) {
    pVVar10 = (pVVar10->field_0).array_.storage_;
  }
  else {
    pVVar10 = (Value<char> *)0x0;
  }
  lVar11 = 0;
  do {
    if (*(char *)((long)&pVVar10->field_0 + lVar11) != "#0123456789ABCDEF0123456789ABCDEF#"[lVar11])
    {
      bVar24 = lVar11 == 0x22;
      goto LAB_0011c582;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x22);
  bVar24 = true;
LAB_0011c582:
  QTest::IsTrue(test,bVar24,0xfd5);
  Value<char>::reset((Value<char> *)&local_d8.array_);
  local_c8 = '\0';
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0x100000000;
  Array<Qentem::Value<char>_>::allocate(&local_88.array_);
  paVar19 = &local_a8;
  Value<char>::reset((Value<char> *)&paVar19->array_);
  Array<Qentem::Value<char>_>::operator=(&paVar19->array_,&local_88.array_);
  local_98 = '\x03';
  Array<Qentem::Value<char>_>::~Array(&local_88.array_);
  Value<char>::Merge((Value<char> *)&local_d8.array_,(Value<char> *)&paVar19->array_);
  if (local_c8 == '\x03') {
    bVar24 = true;
  }
  else if (local_c8 == '\x01') {
    bVar24 = (local_d8.array_.storage_)->type_ == Array;
  }
  else {
    bVar24 = false;
  }
  QTest::IsTrue(test,bVar24,0xfdb);
  for (; *(byte *)((long)paVar21 + 0x10) == 1;
      paVar21 = *(anon_union_16_5_5c8fea6c_for_Value<char>_1 **)&paVar21->array_) {
  }
  if (*(byte *)((long)paVar21 + 0x10) - 2 < 2) {
    uVar9 = *(undefined4 *)((long)&paVar21->array_ + 8);
  }
  else {
    uVar9 = 0;
  }
  local_88._0_4_ = uVar9;
  local_b8._0_4_ = 0;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)local_b8,0xfdc);
  paVar12 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_c8 == '\x03') {
    paVar12 = &local_d8;
  }
  QTest::IsNotNull(test,paVar12,0xfdd);
  paVar12 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)0x0;
  if (local_98 == '\x03') {
    paVar12 = paVar19;
  }
  QTest::IsNotNull(test,paVar12,0xfde);
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0x100000000;
  Array<Qentem::Value<char>_>::allocate(&local_88.array_);
  Value<char>::reset((Value<char> *)&paVar19->array_);
  Array<Qentem::Value<char>_>::operator=(&paVar19->array_,&local_88.array_);
  local_98 = '\x03';
  Array<Qentem::Value<char>_>::~Array(&local_88.array_);
  Value<char>::Merge((Value<char> *)&local_d8.array_,(Value<char> *)&paVar19->array_);
  if (local_c8 == '\x03') {
    bVar24 = true;
  }
  else if (local_c8 == '\x01') {
    bVar24 = (local_d8.array_.storage_)->type_ == Array;
  }
  else {
    bVar24 = false;
  }
  QTest::IsTrue(test,bVar24,0xfe2);
  for (; *(byte *)((long)paVar22 + 0x10) == 1;
      paVar22 = *(anon_union_16_5_5c8fea6c_for_Value<char>_1 **)&paVar22->array_) {
  }
  if (*(byte *)((long)paVar22 + 0x10) - 2 < 2) {
    uVar9 = *(undefined4 *)((long)&paVar22->array_ + 8);
  }
  else {
    uVar9 = 0;
  }
  local_88._0_4_ = uVar9;
  auVar4._12_4_ = 0;
  auVar4._0_12_ = stack0xffffffffffffff4c;
  _local_b8 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
               )(auVar4 << 0x20);
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)local_b8,0xfe3);
  paVar12 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_c8 == '\x03') {
    paVar12 = &local_d8;
  }
  QTest::IsNotNull(test,paVar12,0xfe4);
  if (local_98 != '\x03') {
    paVar19 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)0x0;
  }
  QTest::IsNull(test,paVar19,0xfe5);
  Value<char>::reset((Value<char> *)&local_d8.array_);
  local_c8 = '\0';
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_78 = 9;
  Array<Qentem::Value<char>_>::operator+=(&local_68,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_78 = 8;
  Array<Qentem::Value<char>_>::operator+=(&local_68,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  String<char>::String((String<char> *)local_b8,"-ABCDEF0123456789ABCDEF0123456789-");
  local_88.number_ = (QNumber64)local_b8;
  SVar6 = (SizeT)uStack_b0;
  uStack_b0._0_4_ = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uStack_b0;
  _local_b8 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
               )(auVar2 << 0x40);
  local_88.array_.index_ = SVar6;
  local_78 = 4;
  Array<Qentem::Value<char>_>::operator+=(&local_68,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  auVar5 = local_b8;
  if (local_b8 != (undefined1  [8])0x0) {
    MemoryRecord::RemoveAllocation((void *)local_b8);
  }
  operator_delete((void *)auVar5);
  local_48 = local_68.storage_;
  for (pVVar10 = local_68.storage_ + 2; pVVar10->type_ == ValuePtr;
      pVVar10 = (pVVar10->field_0).array_.storage_) {
  }
  if (pVVar10->type_ == String) {
    local_70 = (pVVar10->field_0).array_.storage_;
  }
  else {
    local_70 = (Value<char> *)0x0;
  }
  Value<char>::reset((Value<char> *)&local_a8.array_);
  Array<Qentem::Value<char>_>::operator=(&local_a8.array_,&local_68);
  local_98 = 3;
  Value<char>::Merge((Value<char> *)&local_d8.array_,(Value<char> *)&local_a8.array_);
  if (local_c8 == '\x03') {
    bVar24 = true;
  }
  else if (local_c8 == '\x01') {
    bVar24 = (local_d8.array_.storage_)->type_ == Array;
  }
  else {
    bVar24 = false;
  }
  QTest::IsTrue(test,bVar24,0xff2);
  for (; *(byte *)((long)paVar23 + 0x10) == 1;
      paVar23 = *(anon_union_16_5_5c8fea6c_for_Value<char>_1 **)&paVar23->array_) {
  }
  if (*(byte *)((long)paVar23 + 0x10) - 2 < 2) {
    uVar9 = *(undefined4 *)((long)&paVar23->array_ + 8);
  }
  else {
    uVar9 = 0;
  }
  local_88._0_4_ = uVar9;
  local_b8._0_4_ = 3;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)local_b8,0xff3);
  paVar19 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_c8 == '\x03') {
    paVar19 = &local_d8;
  }
  QTest::IsNotNull(test,paVar19,0xff4);
  QTest::IsNotNull(test,(void *)local_d8.number_,0xff5);
  local_88.array_.storage_ = local_d8.array_.storage_;
  QTest::IsNotEqual<Qentem::Value<char>const*,Qentem::Value<char>const*>
            (test,&local_88.value_,&local_48,0xff6);
  pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,0);
  bVar25 = true;
  bVar24 = true;
  if (pVVar10->type_ != False) {
    if (pVVar10->type_ == ValuePtr) {
      bVar24 = ((pVVar10->field_0).array_.storage_)->type_ == False;
    }
    else {
      bVar24 = false;
    }
  }
  QTest::IsTrue(test,bVar24,0xff7);
  pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,1);
  if (pVVar10->type_ != True) {
    if (pVVar10->type_ == ValuePtr) {
      bVar25 = ((pVVar10->field_0).array_.storage_)->type_ == True;
    }
    else {
      bVar25 = false;
    }
  }
  QTest::IsTrue(test,bVar25,0xff8);
  pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,2);
  if (pVVar10->type_ == String) {
    bVar24 = true;
  }
  else if (pVVar10->type_ == ValuePtr) {
    bVar24 = ((pVVar10->field_0).array_.storage_)->type_ == String;
  }
  else {
    bVar24 = false;
  }
  QTest::IsTrue(test,bVar24,0xff9);
  for (pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,2);
      pVVar10->type_ == ValuePtr; pVVar10 = (pVVar10->field_0).array_.storage_) {
  }
  if (pVVar10->type_ == String) {
    local_88.array_.storage_ = (pVVar10->field_0).array_.storage_;
  }
  else {
    local_88.array_.storage_ = (Value<char> *)0x0;
  }
  QTest::IsEqual<char_const*,char_const*>(test,(char **)&local_88.value_,(char **)&local_70,0xffa);
  for (pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,2);
      pVVar10->type_ == ValuePtr; pVVar10 = (pVVar10->field_0).array_.storage_) {
  }
  if (pVVar10->type_ == String) {
    pVVar10 = (pVVar10->field_0).array_.storage_;
  }
  else {
    pVVar10 = (Value<char> *)0x0;
  }
  lVar11 = 0;
  do {
    if (*(char *)((long)&pVVar10->field_0 + lVar11) != "-ABCDEF0123456789ABCDEF0123456789-"[lVar11])
    {
      bVar24 = lVar11 == 0x22;
      goto LAB_0011caae;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x22);
  bVar24 = true;
LAB_0011caae:
  QTest::IsTrue(test,bVar24,0xffb);
  Array<Qentem::Value<char>_>::Reset(&local_68);
  local_88.array_.storage_ = (Value<char> *)0x0;
  local_88._8_8_ = 0;
  local_78 = 10;
  Array<Qentem::Value<char>_>::operator+=(&local_68,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  local_88.number_ = (QNumber64)0xe;
  local_78 = 6;
  Array<Qentem::Value<char>_>::operator+=(&local_68,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  String<char>::String((String<char> *)local_b8,"#0123456789ABCDEF0123456789ABCDEF#");
  local_88.number_ = (QNumber64)local_b8;
  SVar6 = (SizeT)uStack_b0;
  uStack_b0._0_4_ = 0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uStack_b0;
  _local_b8 = (HashTable<Qentem::String<char>,_Qentem::HAItem_T<Qentem::String<char>,_Qentem::Value<char>_>_>
               )(auVar3 << 0x40);
  local_88.array_.index_ = SVar6;
  local_78 = 4;
  Array<Qentem::Value<char>_>::operator+=(&local_68,(Value<char> *)&local_88.array_);
  Value<char>::~Value((Value<char> *)&local_88.array_);
  auVar5 = local_b8;
  if (local_b8 != (undefined1  [8])0x0) {
    MemoryRecord::RemoveAllocation((void *)local_b8);
  }
  operator_delete((void *)auVar5);
  local_48 = local_68.storage_;
  for (pVVar10 = local_68.storage_ + 2; pVVar10->type_ == ValuePtr;
      pVVar10 = (pVVar10->field_0).array_.storage_) {
  }
  if (pVVar10->type_ == String) {
    local_50 = (pVVar10->field_0).array_.storage_;
  }
  else {
    local_50 = (Value<char> *)0x0;
  }
  Value<char>::reset((Value<char> *)&local_a8.array_);
  Array<Qentem::Value<char>_>::operator=(&local_a8.array_,&local_68);
  local_98 = '\x03';
  Value<char>::Merge((Value<char> *)&local_d8.array_,(Value<char> *)&local_a8.array_);
  bVar25 = true;
  bVar24 = true;
  if (local_98 != '\0') {
    if (local_98 == '\x01') {
      bVar24 = (local_a8.array_.storage_)->type_ == Undefined;
    }
    else {
      bVar24 = false;
    }
  }
  QTest::IsTrue(test,bVar24,0x1006);
  if (local_c8 != '\x03') {
    if (local_c8 == '\x01') {
      bVar25 = (local_d8.array_.storage_)->type_ == Array;
    }
    else {
      bVar25 = false;
    }
  }
  QTest::IsTrue(test,bVar25,0x1007);
  for (; *(byte *)((long)paVar14 + 0x10) == 1;
      paVar14 = *(anon_union_16_5_5c8fea6c_for_Value<char>_1 **)&paVar14->array_) {
  }
  if (*(byte *)((long)paVar14 + 0x10) - 2 < 2) {
    uVar9 = *(undefined4 *)((long)&paVar14->array_ + 8);
  }
  else {
    uVar9 = 0;
  }
  local_88._0_4_ = uVar9;
  local_b8._0_4_ = 6;
  QTest::IsEqual<unsigned_int,unsigned_int>(test,(uint *)&local_88,(uint *)local_b8,0x1008);
  paVar19 = (anon_union_16_5_5c8fea6c_for_Value<char>_1 *)(undefined1 *)0x0;
  if (local_c8 == '\x03') {
    paVar19 = &local_d8;
  }
  QTest::IsNotNull(test,paVar19,0x1009);
  QTest::IsNotNull(test,(void *)local_d8.number_,0x100a);
  local_88.array_.storage_ = local_d8.array_.storage_;
  QTest::IsNotEqual<Qentem::Value<char>const*,Qentem::Value<char>const*>
            (test,&local_88.value_,&local_48,0x100b);
  pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,0);
  bVar25 = true;
  bVar24 = true;
  if (pVVar10->type_ != False) {
    if (pVVar10->type_ == ValuePtr) {
      bVar24 = ((pVVar10->field_0).array_.storage_)->type_ == False;
    }
    else {
      bVar24 = false;
    }
  }
  QTest::IsTrue(test,bVar24,0x100c);
  pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,1);
  if (pVVar10->type_ != True) {
    if (pVVar10->type_ == ValuePtr) {
      bVar25 = ((pVVar10->field_0).array_.storage_)->type_ == True;
    }
    else {
      bVar25 = false;
    }
  }
  QTest::IsTrue(test,bVar25,0x100d);
  pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,2);
  if (pVVar10->type_ == String) {
    bVar24 = true;
  }
  else if (pVVar10->type_ == ValuePtr) {
    bVar24 = ((pVVar10->field_0).array_.storage_)->type_ == String;
  }
  else {
    bVar24 = false;
  }
  QTest::IsTrue(test,bVar24,0x100e);
  for (pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,2);
      pVVar10->type_ == ValuePtr; pVVar10 = (pVVar10->field_0).array_.storage_) {
  }
  if (pVVar10->type_ == String) {
    local_88.array_.storage_ = (pVVar10->field_0).array_.storage_;
  }
  else {
    local_88.array_.storage_ = (Value<char> *)0x0;
  }
  QTest::IsEqual<char_const*,char_const*>(test,(char **)&local_88.value_,(char **)&local_70,0x100f);
  for (pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,2);
      pVVar10->type_ == ValuePtr; pVVar10 = (pVVar10->field_0).array_.storage_) {
  }
  if (pVVar10->type_ == String) {
    pVVar10 = (pVVar10->field_0).array_.storage_;
  }
  else {
    pVVar10 = (Value<char> *)0x0;
  }
  lVar11 = 0;
  do {
    if (*(char *)((long)&pVVar10->field_0 + lVar11) != "-ABCDEF0123456789ABCDEF0123456789-"[lVar11])
    {
      bVar24 = lVar11 == 0x22;
      goto LAB_0011ce11;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x22);
  bVar24 = true;
LAB_0011ce11:
  QTest::IsTrue(test,bVar24,0x1010);
  pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,3);
  if (pVVar10->type_ == Null) {
    bVar24 = true;
  }
  else if (pVVar10->type_ == ValuePtr) {
    bVar24 = ((pVVar10->field_0).array_.storage_)->type_ == Null;
  }
  else {
    bVar24 = false;
  }
  QTest::IsTrue(test,bVar24,0x1011);
  for (pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,4); pVVar10->type_ == 1;
      pVVar10 = (pVVar10->field_0).array_.storage_) {
  }
  QTest::IsTrue(test,pVVar10->type_ - 5 < 3,0x1012);
  pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,4);
  local_88.number_ = (QNumber64)Value<char>::GetDouble(pVVar10);
  local_b8 = (undefined1  [8])0x402c000000000000;
  QTest::IsEqual<double,double>(test,(double *)&local_88.number_,(double *)local_b8,0x1013);
  pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,5);
  if (pVVar10->type_ == String) {
    bVar24 = true;
  }
  else if (pVVar10->type_ == ValuePtr) {
    bVar24 = ((pVVar10->field_0).array_.storage_)->type_ == String;
  }
  else {
    bVar24 = false;
  }
  QTest::IsTrue(test,bVar24,0x1014);
  for (pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,5);
      pVVar10->type_ == ValuePtr; pVVar10 = (pVVar10->field_0).array_.storage_) {
  }
  if (pVVar10->type_ == String) {
    local_88.array_.storage_ = (pVVar10->field_0).array_.storage_;
  }
  else {
    local_88.array_.storage_ = (Value<char> *)0x0;
  }
  QTest::IsEqual<char_const*,char_const*>(test,(char **)&local_88.value_,(char **)&local_50,0x1015);
  for (pVVar10 = Value<char>::operator[]((Value<char> *)&local_d8.array_,5);
      pVVar10->type_ == ValuePtr; pVVar10 = (pVVar10->field_0).array_.storage_) {
  }
  if (pVVar10->type_ == String) {
    pVVar10 = (pVVar10->field_0).array_.storage_;
  }
  else {
    pVVar10 = (Value<char> *)0x0;
  }
  lVar11 = 0;
  do {
    if (*(char *)((long)&pVVar10->field_0 + lVar11) != "#0123456789ABCDEF0123456789ABCDEF#"[lVar11])
    {
      bVar24 = lVar11 == 0x22;
      goto LAB_0011cf9e;
    }
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x22);
  bVar24 = true;
LAB_0011cf9e:
  QTest::IsTrue(test,bVar24,0x1016);
  Value<char>::reset((Value<char> *)&local_d8.array_);
  pcVar8 = local_40.storage_;
  local_c8 = 0;
  if ((Value<char> *)local_40.storage_ != (Value<char> *)0x0) {
    MemoryRecord::RemoveAllocation(local_40.storage_);
  }
  operator_delete(pcVar8);
  Array<Qentem::Value<char>_>::~Array(&local_68);
  Value<char>::~Value((Value<char> *)&local_a8.array_);
  Value<char>::~Value((Value<char> *)&local_d8.array_);
  return;
}

Assistant:

static void TestAddition5(QTest &test) {
    ValueC        value1;
    ValueC        value2;
    VArray        arr_var;
    const ValueC *arr_storage;
    VString       str;

    /////////////////

    value2 = true;
    test.IsTrue(value2.IsTrue(), __LINE__);

    value1 += Memory::Move(value2);

    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 1U, __LINE__);
    test.IsTrue(value1[0].IsTrue(), __LINE__);

    value2 += true;
    value2 += false;
    value2 += nullptr;
    value2 += "v";
    value2 += 4;
    value2 += VArray(1);
    value2 += VHArray(1);

    value2 = true;
    value1 += Memory::Move(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 2U, __LINE__);
    test.IsTrue(value1[0].IsTrue(), __LINE__);
    test.IsTrue(value1[1].IsTrue(), __LINE__);

    value1.Reset();
    /////////////////

    value2 = false;

    value1 += Memory::Move(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 1U, __LINE__);
    test.IsTrue(value1[0].IsFalse(), __LINE__);

    value2 = false;
    value1 += Memory::Move(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 2U, __LINE__);
    test.IsTrue(value1[0].IsFalse(), __LINE__);
    test.IsTrue(value1[1].IsFalse(), __LINE__);

    value1.Reset();
    /////////////////

    value2 = nullptr;
    value1 += Memory::Move(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 1U, __LINE__);
    test.IsTrue(value1[0].IsNull(), __LINE__);

    value2 = nullptr;
    value1 += Memory::Move(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 2U, __LINE__);
    test.IsTrue(value1[0].IsNull(), __LINE__);
    test.IsTrue(value1[1].IsNull(), __LINE__);

    value1.Reset();
    /////////////////
    str               = VString("-ABCDEF0123456789ABCDEF0123456789-");
    const char *c_str = str.First();
    value2            = Memory::Move(str);

    value1 += Memory::Move(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 1U, __LINE__);
    test.IsTrue(value1[0].IsString(), __LINE__);
    test.IsEqual(value1[0].StringStorage(), c_str, __LINE__);
    test.IsTrue(StringUtils::IsEqual(value1[0].StringStorage(), "-ABCDEF0123456789ABCDEF0123456789-", 34), __LINE__);

    str                = VString("#0123456789ABCDEF0123456789ABCDEF#");
    const char *c_str2 = str.First();
    value2             = Memory::Move(str);

    value1 += Memory::Move(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 2U, __LINE__);
    test.IsTrue(value1[0].IsString(), __LINE__);
    test.IsTrue(value1[1].IsString(), __LINE__);
    test.IsEqual(value1[0].StringStorage(), c_str, __LINE__);
    test.IsEqual(value1[1].StringStorage(), c_str2, __LINE__);
    test.IsTrue(StringUtils::IsEqual(value1[0].StringStorage(), "-ABCDEF0123456789ABCDEF0123456789-", 34), __LINE__);
    test.IsTrue(StringUtils::IsEqual(value1[1].StringStorage(), "#0123456789ABCDEF0123456789ABCDEF#", 34), __LINE__);
    value1.Reset();
    /////////////////

    value2 = VArray(1);
    value1.Merge(value2);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 0U, __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNotNull(value2.GetArray(), __LINE__);

    value2 = VArray(1);
    value1.Merge(Memory::Move(value2));
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 0U, __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNull(value2.GetArray(), __LINE__);

    value1.Reset();
    ///

    arr_var += ValueC{ValueType::False};
    arr_var += ValueC{ValueType::True};
    arr_var += ValueC{VString("-ABCDEF0123456789ABCDEF0123456789-")};
    arr_storage = arr_var.First();
    c_str       = arr_storage[2].StringStorage();
    value2      = Memory::Move(arr_var);

    value1.Merge(Memory::Move(value2));
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 3U, __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNotNull(value1.GetArray()->First(), __LINE__);
    test.IsNotEqual(value1.GetArray()->First(), arr_storage, __LINE__);
    test.IsTrue(value1[0].IsFalse(), __LINE__);
    test.IsTrue(value1[1].IsTrue(), __LINE__);
    test.IsTrue(value1[2].IsString(), __LINE__);
    test.IsEqual(value1[2].StringStorage(), c_str, __LINE__);
    test.IsTrue(StringUtils::IsEqual(value1[2].StringStorage(), "-ABCDEF0123456789ABCDEF0123456789-", 34), __LINE__);

    arr_var.Reset();
    arr_var += ValueC{ValueType::Null};
    arr_var += ValueC{14};
    arr_var += ValueC{VString("#0123456789ABCDEF0123456789ABCDEF#")};
    arr_storage = arr_var.First();
    c_str2      = arr_storage[2].StringStorage();
    value2      = Memory::Move(arr_var);

    value1.Merge(Memory::Move(value2));
    test.IsTrue(value2.IsUndefined(), __LINE__);
    test.IsTrue(value1.IsArray(), __LINE__);
    test.IsEqual(value1.Size(), 6U, __LINE__);
    test.IsNotNull(value1.GetArray(), __LINE__);
    test.IsNotNull(value1.GetArray()->First(), __LINE__);
    test.IsNotEqual(value1.GetArray()->First(), arr_storage, __LINE__);
    test.IsTrue(value1[0].IsFalse(), __LINE__);
    test.IsTrue(value1[1].IsTrue(), __LINE__);
    test.IsTrue(value1[2].IsString(), __LINE__);
    test.IsEqual(value1[2].StringStorage(), c_str, __LINE__);
    test.IsTrue(StringUtils::IsEqual(value1[2].StringStorage(), "-ABCDEF0123456789ABCDEF0123456789-", 34), __LINE__);
    test.IsTrue(value1[3].IsNull(), __LINE__);
    test.IsTrue(value1[4].IsNumber(), __LINE__);
    test.IsEqual(value1[4].GetNumber(), 14.0, __LINE__);
    test.IsTrue(value1[5].IsString(), __LINE__);
    test.IsEqual(value1[5].StringStorage(), c_str2, __LINE__);
    test.IsTrue(StringUtils::IsEqual(value1[5].StringStorage(), "#0123456789ABCDEF0123456789ABCDEF#", 34), __LINE__);
    value1.Reset();
    //////////////////////////////////////////
}